

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArray.H
# Opt level: O0

void __thiscall
amrex::FabArray<amrex::Mask>::FabArray(FabArray<amrex::Mask> *this,FabArray<amrex::Mask> *rhs)

{
  FabArrayBase *pFVar1;
  void *pvVar2;
  long in_RSI;
  FabArrayBase *in_RDI;
  FabArray<amrex::Mask> *in_stack_00000010;
  FabArrayBase *in_stack_ffffffffffffffc8;
  
  FabArrayBase::FabArrayBase(in_RDI,in_stack_ffffffffffffffc8);
  in_RDI->_vptr_FabArrayBase = (_func_int **)&PTR__FabArray_018048a8;
  std::
  unique_ptr<amrex::FabFactory<amrex::Mask>,_std::default_delete<amrex::FabFactory<amrex::Mask>_>_>
  ::unique_ptr((unique_ptr<amrex::FabFactory<amrex::Mask>,_std::default_delete<amrex::FabFactory<amrex::Mask>_>_>
                *)in_RDI,
               (unique_ptr<amrex::FabFactory<amrex::Mask>,_std::default_delete<amrex::FabFactory<amrex::Mask>_>_>
                *)in_stack_ffffffffffffffc8);
  *(undefined8 *)&in_RDI[1].boxarray.m_bat = *(undefined8 *)(in_RSI + 0xf8);
  *(byte *)((long)&in_RDI[1].boxarray.m_bat.m_op + 4) = *(byte *)(in_RSI + 0x100) & 1;
  std::vector<amrex::Mask_*,_std::allocator<amrex::Mask_*>_>::vector
            ((vector<amrex::Mask_*,_std::allocator<amrex::Mask_*>_> *)in_RDI,
             (vector<amrex::Mask_*,_std::allocator<amrex::Mask_*>_> *)in_stack_ffffffffffffffc8);
  pFVar1 = in_RDI + 1;
  pvVar2 = std::exchange<void*,decltype(nullptr)>
                     (&in_RDI->_vptr_FabArrayBase,&in_stack_ffffffffffffffc8->_vptr_FabArrayBase);
  *(void **)((long)&(pFVar1->boxarray).m_bat.m_op + 0x24) = pvVar2;
  *(undefined8 *)((long)&in_RDI[1].boxarray.m_bat.m_op + 0x2c) = *(undefined8 *)(in_RSI + 0x128);
  *(undefined8 *)((long)&in_RDI[1].boxarray.m_bat.m_op + 0x34) = *(undefined8 *)(in_RSI + 0x130);
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::Vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_RDI,
           (Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffffc8);
  ShMem::ShMem((ShMem *)&in_RDI[1].boxarray.m_simplified_list,(ShMem *)(in_RSI + 0x150));
  std::unique_ptr<amrex::FBData<amrex::Mask>,std::default_delete<amrex::FBData<amrex::Mask>>>::
  unique_ptr<std::default_delete<amrex::FBData<amrex::Mask>>,void>
            ((unique_ptr<amrex::FBData<amrex::Mask>,_std::default_delete<amrex::FBData<amrex::Mask>_>_>
              *)in_RDI);
  std::unique_ptr<amrex::PCData<amrex::Mask>,std::default_delete<amrex::PCData<amrex::Mask>>>::
  unique_ptr<std::default_delete<amrex::PCData<amrex::Mask>>,void>
            ((unique_ptr<amrex::PCData<amrex::Mask>,_std::default_delete<amrex::PCData<amrex::Mask>_>_>
              *)in_RDI);
  std::unique_ptr<amrex::FabArray<amrex::Mask>,std::default_delete<amrex::FabArray<amrex::Mask>>>::
  unique_ptr<std::default_delete<amrex::FabArray<amrex::Mask>>,void>
            ((unique_ptr<amrex::FabArray<amrex::Mask>,_std::default_delete<amrex::FabArray<amrex::Mask>_>_>
              *)in_RDI);
  FabArrayBase::FabArrayStats::recordBuild((FabArrayStats *)in_RDI);
  *(undefined1 *)(in_RSI + 0x100) = 0;
  std::vector<amrex::Mask_*,_std::allocator<amrex::Mask_*>_>::clear
            ((vector<amrex::Mask_*,_std::allocator<amrex::Mask_*>_> *)0x12a4fbb);
  clear(in_stack_00000010);
  return;
}

Assistant:

FabArray<FAB>::FabArray (FabArray<FAB>&& rhs) noexcept
    : FabArrayBase (std::move(rhs))
    , m_factory    (std::move(rhs.m_factory))
    , m_dallocator (std::move(rhs.m_dallocator))
    , define_function_called(rhs.define_function_called)
    , m_fabs_v     (std::move(rhs.m_fabs_v))
#ifdef AMREX_USE_GPU
    , m_dp_arrays  (std::exchange(rhs.m_dp_arrays, nullptr))
#endif
    , m_hp_arrays  (std::exchange(rhs.m_hp_arrays, nullptr))
    , m_arrays     (rhs.m_arrays)
    , m_const_arrays(rhs.m_const_arrays)
    , m_tags       (std::move(rhs.m_tags))
    , shmem        (std::move(rhs.shmem))
    // no need to worry about the data used in non-blocking FillBoundary.
{
    m_FA_stats.recordBuild();
    rhs.define_function_called = false; // the responsibility of clear BD has been transferred.
    rhs.m_fabs_v.clear(); // clear the data pointers so that rhs.clear does delete them.
    rhs.clear();
}